

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

TValue * luaH_getint(Table *t,lua_Integer key)

{
  ulong uVar1;
  Node *pNStack_30;
  int nx;
  Node *n;
  lua_Unsigned alimit;
  lua_Integer key_local;
  Table *t_local;
  
  uVar1 = (ulong)t->alimit;
  if (key - 1U < uVar1) {
    t_local = (Table *)(t->array + key + -1);
  }
  else if (((t->flags & 0x80) == 0) || (uVar1 <= (key - 1U & (uVar1 - 1 ^ 0xffffffffffffffff)))) {
    pNStack_30 = hashint(t,key);
    while( true ) {
      if (((pNStack_30->u).key_tt == '\x03') && ((pNStack_30->u).key_val.gc == (GCObject *)key)) {
        return (TValue *)pNStack_30;
      }
      if ((pNStack_30->u).next == 0) break;
      pNStack_30 = pNStack_30 + (pNStack_30->u).next;
    }
    t_local = (Table *)&absentkey;
  }
  else {
    t->alimit = (uint)key;
    t_local = (Table *)(t->array + key + -1);
  }
  return (TValue *)t_local;
}

Assistant:

const TValue *luaH_getint (Table *t, lua_Integer key) {
  lua_Unsigned alimit = t->alimit;
  if (l_castS2U(key) - 1u < alimit)  /* 'key' in [1, t->alimit]? */
    return &t->array[key - 1];
  else if (!isrealasize(t) &&  /* key still may be in the array part? */
           (((l_castS2U(key) - 1u) & ~(alimit - 1u)) < alimit)) {
    t->alimit = cast_uint(key);  /* probably '#t' is here now */
    return &t->array[key - 1];
  }
  else {  /* key is not in the array part; check the hash */
    Node *n = hashint(t, key);
    for (;;) {  /* check whether 'key' is somewhere in the chain */
      if (keyisinteger(n) && keyival(n) == key)
        return gval(n);  /* that's it */
      else {
        int nx = gnext(n);
        if (nx == 0) break;
        n += nx;
      }
    }
    return &absentkey;
  }
}